

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseQueue.cpp
# Opt level: O3

int __thiscall Kernel::ClauseQueue::remove(ClauseQueue *this,char *__filename)

{
  Node *pNVar1;
  Node *pNVar2;
  int iVar3;
  undefined1 *puVar4;
  undefined1 *extraout_RAX;
  uint uVar5;
  Node *pNVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  void **head;
  
  uVar8 = (ulong)this->_height;
  pNVar1 = this->_left;
LAB_0051b4eb:
  pNVar6 = pNVar1;
  uVar8 = uVar8 & 0xffffffff;
  uVar7 = uVar8 * 8 + 0x1f;
  do {
    pNVar1 = pNVar6->nodes[uVar8];
    if (pNVar1 != (Node *)0x0) {
      if (pNVar1->clause == (Clause *)__filename) {
        pNVar6->nodes[uVar8] = pNVar1->nodes[uVar8];
        if ((int)uVar8 != 0) break;
        goto LAB_0051b582;
      }
      iVar3 = (*this->_vptr_ClauseQueue[2])(this,__filename);
      if ((char)iVar3 == '\0') goto LAB_0051b4eb;
    }
    if ((int)uVar8 == 0) {
      return 0;
    }
    uVar8 = uVar8 - 1;
    uVar7 = uVar7 - 8;
  } while( true );
  do {
    uVar9 = uVar8 - 1;
    pNVar2 = pNVar6;
    do {
      pNVar6 = pNVar2;
      pNVar2 = pNVar6->nodes[uVar8 - 1];
    } while (pNVar6->nodes[uVar8 - 1] != pNVar1);
    pNVar6->nodes[uVar8 - 1] = pNVar1->nodes[uVar8 - 1];
    uVar8 = uVar9;
  } while (uVar9 != 0);
  uVar7 = uVar7 & 0xffffffff0;
  if (uVar7 == 0) {
    puVar4 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR;
    pNVar1->clause = (Clause *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pNVar1;
  }
  else if (uVar7 < 0x11) {
LAB_0051b582:
    puVar4 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR;
    pNVar1->clause = (Clause *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pNVar1;
  }
  else if (uVar7 < 0x19) {
    puVar4 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR;
    pNVar1->clause = (Clause *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pNVar1;
  }
  else if (uVar7 < 0x21) {
    puVar4 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR;
    pNVar1->clause = (Clause *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pNVar1;
  }
  else if (uVar7 < 0x31) {
    puVar4 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR;
    pNVar1->clause = (Clause *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pNVar1;
  }
  else if (uVar7 < 0x41) {
    puVar4 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR;
    pNVar1->clause = (Clause *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pNVar1;
  }
  else {
    operator_delete(pNVar1,0x10);
    puVar4 = extraout_RAX;
  }
  uVar5 = this->_height;
  iVar3 = (int)CONCAT71((int7)((ulong)puVar4 >> 8),1);
  if (uVar5 != 0) {
    do {
      if (this->_left->nodes[uVar5] != (Node *)0x0) {
        return iVar3;
      }
      uVar5 = uVar5 - 1;
      this->_height = uVar5;
    } while (uVar5 != 0);
  }
  return iVar3;
}

Assistant:

bool ClauseQueue::remove(Clause* c)
{
  unsigned h = _height;
  Node* left = _left;

  for (;;) {
    Node* next = left->nodes[h];
    if (next && c == next->clause) {
      unsigned height = h;
      // found, first change the links going to next
      for (;;) {
	left->nodes[h] = next->nodes[h];
	if (h == 0) {
	  break;
	}
	h--;
	while (left->nodes[h] != next) {
	  left = left->nodes[h];
	}
      }
      // deallocate the node
      DEALLOC_KNOWN(next,
		    sizeof(Node)+height*sizeof(Node*),
		    "ClauseQueue::Node");
      while (_height > 0 && ! _left->nodes[_height]) {
	_height--;
      }
      return true;
    }

    if (next == 0 || lessThan(c,next->clause)) {
      if(h==0) {

#if VDEBUG
       ClauseQueue::Iterator it(*this);
       while(it.hasNext()){
         ASS(it.next()!=c);
       }
#endif

	return false;
      }
      h--;
    }
    else {
      left = next;
    }
  }
}